

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Dequantize_x86_avx::forward
          (Dequantize_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Allocator *pAVar5;
  Mat *pMVar6;
  Mat *pMVar7;
  ulong uVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  float *pfVar12;
  int *piVar13;
  Allocator *pAVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  ulong uVar18;
  Allocator *local_50;
  
  uVar1 = bottom_blob->elempack;
  iVar2 = bottom_blob->dims;
  iVar3 = bottom_blob->w;
  uVar16 = bottom_blob->h;
  uVar15 = bottom_blob->c;
  Mat::create_like(top_blob,bottom_blob,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  lVar11 = (long)(int)uVar1;
  if (iVar2 == 3) {
    if ((int)uVar15 < 1) {
      return 0;
    }
    lVar9 = 0;
    uVar18 = 0;
    do {
      piVar13 = (int *)(bottom_blob->cstep * uVar18 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
      pfVar12 = (float *)(top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Dequantize).scale_data_size < 2) {
        pMVar7 = (Mat *)(this->super_Dequantize).scale_data.data;
        piVar17 = (this->super_Dequantize).scale_data.refcount;
        local_50 = (this->super_Dequantize).scale_data.allocator;
        pMVar6 = (Mat *)(ulong)(uint)(this->super_Dequantize).scale_data.w;
        if (piVar17 == (int *)0x0) goto LAB_0043983b;
        LOCK();
        *piVar17 = *piVar17 + 1;
        UNLOCK();
      }
      else {
        pMVar7 = (Mat *)((this->super_Dequantize).scale_data.elemsize * lVar9 +
                        (long)(this->super_Dequantize).scale_data.data);
        local_50 = (this->super_Dequantize).scale_data.allocator;
        pMVar6 = (Mat *)(ulong)uVar1;
LAB_0043983b:
        piVar17 = (int *)0x0;
      }
      if ((this->super_Dequantize).bias_data_size < 2) {
        pvVar10 = (this->super_Dequantize).bias_data.data;
        piVar4 = (this->super_Dequantize).bias_data.refcount;
        uVar16 = (this->super_Dequantize).bias_data.w;
        if (piVar4 == (int *)0x0) goto LAB_004398c6;
        pAVar14 = (this->super_Dequantize).bias_data.allocator;
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
        dequantize(piVar13,pfVar12,pMVar7,pMVar6,(int)pvVar10,uVar16);
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pAVar14 == (Allocator *)0x0) {
            if (pvVar10 != (void *)0x0) {
              free(pvVar10);
            }
          }
          else {
            (**(code **)(*(long *)pAVar14 + 0x18))(pAVar14,pvVar10);
          }
        }
      }
      else {
        pvVar10 = (void *)((this->super_Dequantize).bias_data.elemsize * lVar9 +
                          (long)(this->super_Dequantize).bias_data.data);
        uVar16 = uVar1;
LAB_004398c6:
        dequantize(piVar13,pfVar12,pMVar7,pMVar6,(int)pvVar10,uVar16);
      }
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_50 == (Allocator *)0x0) {
            if (pMVar7 != (Mat *)0x0) {
              free(pMVar7);
            }
          }
          else {
            (**(code **)(*(long *)local_50 + 0x18))(local_50,pMVar7);
          }
        }
      }
      uVar18 = uVar18 + 1;
      lVar9 = lVar9 + lVar11;
    } while (uVar15 != uVar18);
  }
  else if (iVar2 == 2) {
    if ((int)uVar16 < 1) {
      return 0;
    }
    lVar9 = 0;
    uVar18 = 0;
    do {
      piVar13 = (int *)((long)bottom_blob->w * uVar18 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
      pfVar12 = (float *)((long)top_blob->w * uVar18 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Dequantize).scale_data_size < 2) {
        pMVar7 = (Mat *)(this->super_Dequantize).scale_data.data;
        piVar17 = (this->super_Dequantize).scale_data.refcount;
        pAVar14 = (this->super_Dequantize).scale_data.allocator;
        pMVar6 = (Mat *)(ulong)(uint)(this->super_Dequantize).scale_data.w;
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar17 = *piVar17 + 1;
          UNLOCK();
        }
      }
      else {
        pMVar7 = (Mat *)((this->super_Dequantize).scale_data.elemsize * lVar9 +
                        (long)(this->super_Dequantize).scale_data.data);
        pAVar14 = (this->super_Dequantize).scale_data.allocator;
        piVar17 = (int *)0x0;
        pMVar6 = (Mat *)(ulong)uVar1;
      }
      if ((this->super_Dequantize).bias_data_size < 2) {
        pvVar10 = (this->super_Dequantize).bias_data.data;
        piVar4 = (this->super_Dequantize).bias_data.refcount;
        uVar15 = (this->super_Dequantize).bias_data.w;
        if (piVar4 == (int *)0x0) goto LAB_00439724;
        pAVar5 = (this->super_Dequantize).bias_data.allocator;
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
        dequantize(piVar13,pfVar12,pMVar7,pMVar6,(int)pvVar10,uVar15);
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar10 != (void *)0x0) {
              free(pvVar10);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))(pAVar5,pvVar10);
          }
        }
      }
      else {
        pvVar10 = (void *)((this->super_Dequantize).bias_data.elemsize * lVar9 +
                          (long)(this->super_Dequantize).bias_data.data);
        uVar15 = uVar1;
LAB_00439724:
        dequantize(piVar13,pfVar12,pMVar7,pMVar6,(int)pvVar10,uVar15);
      }
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (pAVar14 == (Allocator *)0x0) {
            if (pMVar7 != (Mat *)0x0) {
              free(pMVar7);
            }
          }
          else {
            (**(code **)(*(long *)pAVar14 + 0x18))(pAVar14,pMVar7);
          }
        }
      }
      uVar18 = uVar18 + 1;
      lVar9 = lVar9 + lVar11;
    } while (uVar16 != uVar18);
  }
  else {
    if (iVar2 != 1) {
      return 0;
    }
    uVar18 = (long)iVar3 / (long)opt->num_threads;
    uVar8 = 1;
    if (1 < (int)uVar18) {
      uVar8 = uVar18 & 0xffffffff;
    }
    uVar18 = (long)(iVar3 + (int)uVar8 + -1) / (long)(int)uVar8;
    if ((int)uVar18 < 1) {
      return 0;
    }
    uVar18 = uVar18 & 0xffffffff;
    lVar9 = 0;
    do {
      dequantize((int *)((long)bottom_blob->data + lVar9),(float *)((long)top_blob->data + lVar9),
                 (Mat *)(this->super_Dequantize).scale_data.data,
                 (Mat *)(ulong)(uint)(this->super_Dequantize).scale_data.w,
                 (int)(this->super_Dequantize).bias_data.data,(this->super_Dequantize).bias_data.w);
      lVar9 = lVar9 + lVar11 * uVar8 * 4;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  return 0;
}

Assistant:

int Dequantize_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            float* ptr = (float*)top_blob + i * elempack;

            // assert scale_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            dequantize(intptr, ptr, scale_data, bias_data, size, 1);
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_i, bias_data_i, w, elempack);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;

            dequantize(intptr, ptr, scale_data_q, bias_data_q, w * h, elempack);
        }
    }

    return 0;
}